

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCheck.hpp
# Opt level: O2

void FMB::ModelCheck::doCheck(UnitList *units)

{
  Connective CVar1;
  int iVar2;
  Unit *pUVar3;
  long *plVar4;
  Set<Kernel::Term_*,_Lib::DefaultHash> *pSVar5;
  Term *this;
  bool bVar6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  ostream *poVar11;
  Formula *pFVar12;
  undefined4 extraout_var;
  unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
  *puVar13;
  int *piVar14;
  UserErrorException *pUVar15;
  char *pcVar16;
  undefined8 *puVar17;
  uint val;
  List<Kernel::Unit_*> *pLVar18;
  undefined1 auVar19 [16];
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> it;
  string name_1;
  Set<Kernel::Term_*,_Lib::DefaultHash> domainConstants;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
  local_220;
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> domainConstantNumber;
  DArray<unsigned_int> sortSizesArray;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> sortSizes;
  DArray<unsigned_int> local_1b0;
  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  domainConstantsPerSort;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  FiniteModelMultiSorted model;
  string local_50;
  
  sortSizes._timestamp = 1;
  sortSizes._size = 0;
  sortSizes._deleted = 0;
  sortSizes._capacityIndex = 0;
  sortSizes._capacity = 0;
  sortSizes._20_8_ = 0;
  sortSizes._28_8_ = 0;
  sortSizes._afterLast._4_4_ = 0;
  domainConstantsPerSort._afterLast._4_4_ = 0;
  domainConstantsPerSort._size = 0;
  domainConstantsPerSort._deleted = 0;
  domainConstantsPerSort._capacityIndex = 0;
  domainConstantsPerSort._capacity = 0;
  domainConstantsPerSort._20_8_ = 0;
  domainConstantsPerSort._28_8_ = 0;
  pLVar18 = units;
  domainConstantsPerSort._timestamp = sortSizes._timestamp;
  do {
    do {
      if (pLVar18 == (UnitList *)0x0) {
        if (sortSizes._size == 0) {
          pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
          Lib::UserErrorException::Exception
                    (pUVar15,
                     "No domain definition found!\n Use vampire(model_check,model_start). MODEL_DEFINITION_FORMULAS. vampire(model_check,model_end)."
                    );
          __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        poVar11 = std::operator<<((ostream *)&std::cout,"Loading model...");
        std::endl<char,std::char_traits<char>>(poVar11);
        Lib::DArray<unsigned_int>::DArray
                  (&sortSizesArray,
                   (ulong)((long)(DAT_00a14190->_typeCons)._cursor -
                          (long)(DAT_00a14190->_typeCons)._stack) >> 3 & 0xffffffff);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::items
                  ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)&model)
        ;
        while (cVar7 = (**(code **)(*(long *)model._sizes._size + 0x10))(), cVar7 != '\0') {
          auVar19 = (**(code **)(*(long *)model._sizes._size + 0x18))();
          sortSizesArray._array[*auVar19._0_8_] = *auVar19._8_8_;
        }
        Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
        ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> *)
                         &model);
        Lib::DArray<unsigned_int>::DArray(&local_1b0,&sortSizesArray);
        FiniteModelMultiSorted::FiniteModelMultiSorted(&model,&local_1b0);
        Lib::DArray<unsigned_int>::~DArray(&local_1b0);
        Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Set(&domainConstants);
        domainConstantNumber._timestamp = 1;
        domainConstantNumber._size = 0;
        domainConstantNumber._deleted = 0;
        domainConstantNumber._capacityIndex = 0;
        domainConstantNumber._capacity = 0;
        domainConstantNumber._20_8_ = 0;
        domainConstantNumber._28_8_ = 0;
        domainConstantNumber._afterLast._4_4_ = 0;
        poVar11 = std::operator<<((ostream *)&std::cout,"Detected model with ");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        poVar11 = std::operator<<(poVar11," sorts.");
        std::endl<char,std::char_traits<char>>(poVar11);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::items
                  ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)&it);
        while (iVar10 = (*(it._core)->_vptr_IteratorCore[2])(), (char)iVar10 != '\0') {
          iVar10 = (*(it._core)->_vptr_IteratorCore[3])();
          puVar13 = Lib::
                    DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                    ::get(&domainConstantsPerSort,*(uint *)CONCAT44(extraout_var,iVar10));
          pSVar5 = (puVar13->_M_t).
                   super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                   .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>.
                   _M_head_impl;
          std::operator+(&local_248,"  domain for ",
                         &(DAT_00a14190->_typeCons)._stack[*(uint *)CONCAT44(extraout_var,iVar10)]->
                          _name);
          std::operator+(&name_1,&local_248," of size ");
          poVar11 = std::operator<<((ostream *)&std::cout,(string *)&name_1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__cxx11::string::~string((string *)&name_1);
          std::__cxx11::string::~string((string *)&local_248);
          poVar11 = std::operator<<((ostream *)&std::cout,", domain elements are:");
          std::endl<char,std::char_traits<char>>(poVar11);
          local_248._M_dataplus._M_p = (pointer)pSVar5->_entries;
          local_248._M_string_length = (size_type)pSVar5->_afterLast;
          uVar9 = 1;
          while (bVar6 = Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Iterator::hasNext
                                   ((Iterator *)&local_248), bVar6) {
            this = *(Term **)(local_248._M_dataplus._M_p + 8);
            local_248._M_dataplus._M_p = local_248._M_dataplus._M_p + 0x10;
            poVar11 = std::operator<<((ostream *)&std::cout,"    ");
            Kernel::Term::toString_abi_cxx11_(&name_1,this,true);
            poVar11 = std::operator<<(poVar11,(string *)&name_1);
            std::endl<char,std::char_traits<char>>(poVar11);
            std::__cxx11::string::~string((string *)&name_1);
            Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::insert(&domainConstants,this);
            Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      (&domainConstantNumber,this,uVar9);
            name_1._M_dataplus._M_p = (pointer)0x0;
            name_1._M_string_length = 0;
            name_1.field_2._M_allocated_capacity = 0;
            FiniteModelMultiSorted::addFunctionDefinition
                      (&model,this->_functor,(DArray<unsigned_int> *)&name_1,uVar9);
            Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)&name_1);
            uVar9 = uVar9 + 1;
          }
        }
        pLVar18 = units;
        do {
          do {
            if (pLVar18 == (UnitList *)0x0) {
              poVar11 = std::operator<<((ostream *)&std::cout,"Model loaded");
              std::endl<char,std::char_traits<char>>(poVar11);
              poVar11 = std::operator<<((ostream *)&std::cout,"Checking formulas...");
              std::endl<char,std::char_traits<char>>(poVar11);
              bVar6 = true;
              while (units != (UnitList *)0x0) {
                pUVar3 = units->_head;
                units = units->_tail;
                if (((undefined1  [48])pUVar3->_inference & (undefined1  [48])0x1c) !=
                    (undefined1  [48])0x18) {
                  poVar11 = std::operator<<((ostream *)&std::cout,"Checking ");
                  Kernel::Unit::toString_abi_cxx11_(&name_1,pUVar3);
                  poVar11 = std::operator<<(poVar11,(string *)&name_1);
                  poVar11 = std::operator<<(poVar11,"...");
                  std::endl<char,std::char_traits<char>>(poVar11);
                  std::__cxx11::string::~string((string *)&name_1);
                  bVar8 = FiniteModelMultiSorted::evaluate(&model,pUVar3);
                  poVar11 = std::operator<<((ostream *)&std::cout,"Evaluates to ");
                  pcVar16 = "False";
                  if (bVar8) {
                    pcVar16 = "True";
                  }
                  poVar11 = std::operator<<(poVar11,pcVar16);
                  bVar6 = bVar8 && bVar6;
                  std::endl<char,std::char_traits<char>>(poVar11);
                }
              }
              pcVar16 = "There was a false formula!";
              if (bVar6) {
                pcVar16 = "All formulas evaluated to True!";
              }
              poVar11 = std::operator<<((ostream *)&std::cout,pcVar16);
              std::endl<char,std::char_traits<char>>(poVar11);
              Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
              ~VirtualIterator(&it);
              Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                        (&domainConstantNumber);
              Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::~Set(&domainConstants);
              FiniteModelMultiSorted::~FiniteModelMultiSorted(&model);
              Lib::DArray<unsigned_int>::~DArray(&sortSizesArray);
              Lib::
              DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::~DHMap(&domainConstantsPerSort);
              Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                        (&sortSizes);
              return;
            }
            pUVar3 = pLVar18->_head;
            pLVar18 = pLVar18->_tail;
          } while (((undefined1  [48])pUVar3->_inference & (undefined1  [48])0x1c) !=
                   (undefined1  [48])0x18);
          name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
          name_1._M_string_length = 0;
          name_1.field_2._M_allocated_capacity =
               name_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
          Parse::TPTP::findAxiomName(pUVar3,&name_1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"finite_domain",&local_2a9);
          bVar6 = Lib::StringUtils::starts_with(&name_1,&local_248);
          if (bVar6) {
            std::__cxx11::string::~string((string *)&local_248);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"distinct_domain",&local_2aa);
            bVar6 = Lib::StringUtils::starts_with(&name_1,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_248);
            if (!bVar6) {
              if ((pUVar3->field_0x4 & 1) == 0) {
                pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
                Lib::UserErrorException::Exception
                          (pUVar15,"Expecting model to use formulas i.e. fof/tff");
                __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                            Lib::UserErrorException::~UserErrorException);
              }
              pFVar12 = Kernel::Unit::getFormula(pUVar3);
              CVar1 = pFVar12->_connective;
              if (CVar1 == LITERAL) {
                addDefinition(&model,*(Literal **)(pFVar12 + 1),false,&domainConstants,
                              &domainConstantNumber);
              }
              else if (CVar1 == AND) {
                puVar17 = *(undefined8 **)(pFVar12 + 1);
                while (puVar17 != (undefined8 *)0x0) {
                  piVar14 = (int *)*puVar17;
                  iVar10 = *piVar14;
                  iVar2 = iVar10;
                  if (iVar10 == 6) {
                    piVar14 = *(int **)(piVar14 + 10);
                    iVar2 = *piVar14;
                  }
                  if (iVar2 != 0) {
                    pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
                    Lib::UserErrorException::Exception(pUVar15,"Badly formed definition");
                    __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                                Lib::UserErrorException::~UserErrorException);
                  }
                  puVar17 = (undefined8 *)puVar17[1];
                  addDefinition(&model,*(Literal **)(piVar14 + 10),iVar10 == 6,&domainConstants,
                                &domainConstantNumber);
                }
              }
              else {
                if (CVar1 != NOT) {
                  pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
                  Kernel::Formula::toString_abi_cxx11_(&local_248,pFVar12);
                  std::operator+(&local_170,"Expecting conjunction of definitions in model:\n",
                                 &local_248);
                  Lib::UserErrorException::Exception(pUVar15,&local_170);
                  __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                              Lib::UserErrorException::~UserErrorException);
                }
                if (**(int **)(pFVar12 + 1) != 0) {
                  pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
                  Kernel::Formula::toString_abi_cxx11_(&local_248,pFVar12);
                  std::operator+(&local_150,"Unexpected negation in ",&local_248);
                  Lib::UserErrorException::Exception(pUVar15,&local_150);
                  __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                              Lib::UserErrorException::~UserErrorException);
                }
                addDefinition(&model,*(Literal **)(*(int **)(pFVar12 + 1) + 10),true,
                              &domainConstants,&domainConstantNumber);
              }
            }
          }
          std::__cxx11::string::~string((string *)&name_1);
        } while( true );
      }
      pUVar3 = pLVar18->_head;
      pLVar18 = pLVar18->_tail;
    } while (((undefined1  [48])pUVar3->_inference & (undefined1  [48])0x1c) !=
             (undefined1  [48])0x18);
    model._sizes._size = (size_t)&model._sizes._array;
    model._sizes._capacity = 0;
    model._sizes._array._0_1_ = 0;
    Parse::TPTP::findAxiomName(pUVar3,(string *)&model);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&domainConstants,"finite_domain",(allocator<char> *)&domainConstantNumber);
    bVar6 = Lib::StringUtils::starts_with((string *)&model,(string *)&domainConstants);
    std::__cxx11::string::~string((string *)&domainConstants);
    if (bVar6) {
      poVar11 = std::operator<<((ostream *)&std::cout,"Finite domain axiom found:");
      poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
      Kernel::Unit::toString_abi_cxx11_((string *)&domainConstants,pUVar3);
      poVar11 = std::operator<<(poVar11,(string *)&domainConstants);
      std::endl<char,std::char_traits<char>>(poVar11);
      std::__cxx11::string::~string((string *)&domainConstants);
      if ((pUVar3->field_0x4 & 1) == 0) {
        pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
        Lib::UserErrorException::Exception(pUVar15,"finite_domain in cnf (use fof/tff instead)");
        __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      pFVar12 = Kernel::Unit::getFormula(pUVar3);
      if (pFVar12->_connective != FORALL) {
        pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
        Lib::UserErrorException::Exception(pUVar15,"finite_domain is not a domain axiom");
        __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      piVar14 = (int *)pFVar12[1]._label._M_string_length;
      uVar9 = Lib::List<unsigned_int>::length(*(List<unsigned_int> **)(pFVar12 + 1));
      if (uVar9 != 1) {
        pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
        Lib::UserErrorException::Exception
                  (pUVar15,"finite_domain must start with forall over a single variable");
        __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      plVar4 = (long *)pFVar12[1]._label._M_dataplus._M_p;
      if (plVar4 == (long *)0x0) {
        uVar9 = Kernel::Signature::getDefaultSort(DAT_00a14190);
      }
      else {
        uVar9 = *(uint *)(*plVar4 + 8);
      }
      std::make_unique<Lib::Set<Kernel::Term*,Lib::DefaultHash>>();
      domainConstantNumber._timestamp = 0xffffffff;
      if (*piVar14 == 0) {
        checkIsDomainLiteral
                  (*(Literal **)(piVar14 + 10),(int *)&domainConstantNumber,
                   (Set<Kernel::Term_*,_Lib::DefaultHash> *)domainConstants._0_8_);
        val = 1;
      }
      else {
        if (*piVar14 != 2) {
          pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
          Lib::UserErrorException::Exception(pUVar15,"finite_domain is not a domain axiom");
          __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        puVar17 = *(undefined8 **)(piVar14 + 10);
        val = 0;
        while (puVar17 != (undefined8 *)0x0) {
          piVar14 = (int *)*puVar17;
          if (*piVar14 != 0) {
            pUVar15 = (UserErrorException *)__cxa_allocate_exception(0x50);
            Lib::UserErrorException::Exception(pUVar15,"finite_domain is not a domain axiom");
            __cxa_throw(pUVar15,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
          puVar17 = (undefined8 *)puVar17[1];
          val = val + 1;
          checkIsDomainLiteral
                    (*(Literal **)(piVar14 + 10),(int *)&domainConstantNumber,
                     (Set<Kernel::Term_*,_Lib::DefaultHash> *)domainConstants._0_8_);
        }
      }
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::set
                (&sortSizes,uVar9,val);
      local_220._M_t.
      super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>,_true,_true>
              )domainConstants._0_8_;
      domainConstants._capacity = 0;
      domainConstants._nonemptyCells = 0;
      Lib::
      DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::set(&domainConstantsPerSort,uVar9,&local_220);
      std::
      unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      ::~unique_ptr(&local_220);
      std::
      unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      ::~unique_ptr((unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                     *)&domainConstants);
    }
    std::__cxx11::string::~string((string *)&model);
  } while( true );
}

Assistant:

static void doCheck(UnitList* units)
{
  // find model size
  // looking for a domain axiom with a name starting 'finite_domain' (TODO search for something of the right shape)

  DHMap<unsigned,unsigned> sortSizes;
  DHMap<unsigned,std::unique_ptr<Set<Term*>>> domainConstantsPerSort;

  // first just search for finite_domain axiom (TODO: do this for every sort!)
  {
    UnitList::Iterator uit(units);
    while(uit.hasNext()){
      Unit* u = uit.next();
      if(u->inputType()!= UnitInputType::MODEL_DEFINITION) continue;
      std::string name;
      ALWAYS(Parse::TPTP::findAxiomName(u,name));
      if(StringUtils::starts_with(name,"finite_domain")){
        std::cout << "Finite domain axiom found:" << std::endl << u->toString() << std::endl;
        // Set model size and domainConstants
        // And check it is a finite domain axiom
        if(u->isClause()) USER_ERROR("finite_domain in cnf (use fof/tff instead)");

        Formula* formula = u->getFormula();
        if(formula->connective()!=Connective::FORALL) USER_ERROR("finite_domain is not a domain axiom");
        Formula* subformula = formula->qarg();

        if (VList::length(formula->vars()) != 1) USER_ERROR("finite_domain must start with forall over a single variable");
        unsigned curSort = (formula->sorts()) ? formula->sorts()->head().term()->functor() : env.signature->getDefaultSort();

        unsigned curModelSize = 0;
        auto curDomainConstants = std::make_unique<Set<Term*>>();

        int single_var = -1;
        if (subformula->connective()==Connective::OR) {
          FormulaList* args = subformula->args();
          FormulaList::Iterator fit(args);
          while(fit.hasNext()){
            curModelSize++;
            Formula* arg = fit.next();
            if(arg->connective()!=Connective::LITERAL) USER_ERROR("finite_domain is not a domain axiom");
            Literal* l = arg->literal();
            checkIsDomainLiteral(l,single_var,*curDomainConstants);
          }
        } else if (subformula->connective()==Connective::LITERAL) {
          curModelSize = 1;
          checkIsDomainLiteral(subformula->literal(),single_var,*curDomainConstants);
        } else USER_ERROR("finite_domain is not a domain axiom");

        sortSizes.set(curSort,curModelSize);
        domainConstantsPerSort.set(curSort,std::move(curDomainConstants));
      }
    }
  }

  if (sortSizes.size() == 0) {
    USER_ERROR("No domain definition found!\n Use vampire(model_check,model_start). MODEL_DEFINITION_FORMULAS. vampire(model_check,model_end).");
  }

  std::cout << "Loading model..." << std::endl;
  DArray<unsigned> sortSizesArray(env.signature->typeCons());
  {
    auto it = sortSizes.items();
    while (it.hasNext()) {
      auto [sort,curModelSize] = it.next();
      sortSizesArray[sort] = curModelSize;
    }
  }
  // TODO can we pass a reference here instead of clone()ing?
  FiniteModelMultiSorted model(sortSizesArray.clone());

  Set<Term*> domainConstants; // union of all the perSort ones
  DHMap<Term*,unsigned> domainConstantNumber;

  std::cout << "Detected model with " << sortSizes.size() << " sorts." << std::endl;
  auto it = sortSizes.items();
  while (it.hasNext()) {
    auto [sort,curModelSize] = it.next();
    auto& curDomainConstants = *domainConstantsPerSort.get(sort);
    ASS_EQ(curModelSize,(unsigned)curDomainConstants.size());

    std::cout << "  domain for " + env.signature->getTypeCon(sort)->name() + " of size " << curModelSize;
    std::cout << ", domain elements are:" << std::endl;

    // number the domain constants
    Set<Term*>::Iterator dit(curDomainConstants);
    unsigned count=1;
    while(dit.hasNext()){
      Term* con = dit.next();
      std::cout << "    " << con->toString() << std::endl;
      domainConstants.insert(con);
      domainConstantNumber.insert(con,count);
      model.addFunctionDefinition(con->functor(),DArray<unsigned>(0),count);
      count++;
    }
  }

  {
    UnitList::Iterator uit(units);
    while(uit.hasNext()){
      Unit* u = uit.next();
      if(u->inputType()!= UnitInputType::MODEL_DEFINITION) continue;
      std::string name;
      ALWAYS(Parse::TPTP::findAxiomName(u,name));
      if(StringUtils::starts_with(name,"finite_domain") || StringUtils::starts_with(name,"distinct_domain")) continue;

      // All model formulas should be conjunctions of definitions
      // TODO allow for unit clause definitions in the future
      if(u->isClause()) USER_ERROR("Expecting model to use formulas i.e. fof/tff");
      Formula* formula = u->getFormula();

      if(formula->connective()==Connective::NOT){
        Formula* inner = formula->uarg();
        if(inner->connective()==Connective::LITERAL){
          addDefinition(model,inner->literal(),true,domainConstants,domainConstantNumber);
        }
        else USER_ERROR("Unexpected negation in "+formula->toString());
      }
      else if(formula->connective()==Connective::LITERAL){
        addDefinition(model,formula->literal(),false,domainConstants,domainConstantNumber);
      }
      else{
        if(formula->connective()!=Connective::AND)
          USER_ERROR("Expecting conjunction of definitions in model:\n"+formula->toString());
        FormulaList* defs = formula->args();
        FormulaList::Iterator fit(defs);
        while(fit.hasNext()){
          unsigned negated = false;
          Formula* def = fit.next();
          if(def->connective()==Connective::NOT){
            def = def->uarg();
            negated=true;
          }
          if(def->connective()!=Connective::LITERAL) USER_ERROR("Badly formed definition");
          Literal* lit = def->literal();
          addDefinition(model,lit,negated,domainConstants,domainConstantNumber);
        }
      }
    }
    std::cout << "Model loaded" << std::endl;
    std::cout << "Checking formulas..." << std::endl;
    {
      bool allTrue = true;
      UnitList::Iterator uit(units);
      while(uit.hasNext()){
        Unit* u = uit.next();
        if(u->inputType()== UnitInputType::MODEL_DEFINITION) continue;

        std::cout << "Checking " << u->toString() << "..." << std::endl;
        bool res = model.evaluate(u);
        allTrue &= res;
        std::cout << "Evaluates to " << (res ? "True" : "False") << std::endl;
      }
      if (allTrue) {
        std::cout << "All formulas evaluated to True!" << std::endl;
      } else {
        std::cout << "There was a false formula!" << std::endl;
      }
    }
  }
}